

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

char FIX::CharConvertor::convert(string *value)

{
  bool bVar1;
  FieldConvertError *this;
  char local_11;
  string *psStack_10;
  char result;
  string *value_local;
  
  local_11 = '\0';
  psStack_10 = value;
  bVar1 = convert(value,&local_11);
  if (!bVar1) {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,psStack_10);
    __cxa_throw(this,&FieldConvertError::typeinfo,FieldConvertError::~FieldConvertError);
  }
  return local_11;
}

Assistant:

EXCEPT(FieldConvertError) {
    char result = '\0';
    if (!convert(value, result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }